

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtWriter.cpp
# Opt level: O3

ssize_t __thiscall axl::io::ShmtWriter::write(ShmtWriter *this,int __fd,void *__buf,size_t __n)

{
  int32_t *piVar1;
  size_t sVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_t sVar6;
  ulong uVar7;
  ShmtFileHdr *pSVar8;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t extraout_RDX_01;
  __sighandler_t p_Var9;
  __sighandler_t extraout_RDX_02;
  __sighandler_t __handler;
  ulong uVar10;
  ulong uVar11;
  undefined4 in_register_00000034;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_68;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  
  if (__n == 0) {
    return 0;
  }
  uVar11 = 0;
  sVar6 = 0;
  do {
    uVar11 = uVar11 + *(long *)((long)__buf + sVar6 * 8);
    sVar6 = sVar6 + 1;
  } while (__n != sVar6);
  if (uVar11 == 0) {
    return 0;
  }
  uVar7 = uVar11 + 0xf & 0xfffffffffffffff8;
  if (((this->super_ShmtBase).m_flags >> 0x10 & 1) == 0) {
    uVar7 = uVar11;
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->m_writeLock);
  pSVar8 = (this->super_ShmtBase).m_hdr;
  while( true ) {
    piVar1 = &pSVar8->m_lock;
    LOCK();
    bVar15 = *piVar1 == 0;
    if (bVar15) {
      *piVar1 = 1;
    }
    UNLOCK();
    if (bVar15) break;
    sched_yield();
  }
  pSVar8 = (this->super_ShmtBase).m_hdr;
  if (((pSVar8->m_dataSize != 0) && (pSVar8->m_writeOffset <= pSVar8->m_readOffset)) &&
     ((ulong)pSVar8->m_readOffset < pSVar8->m_writeOffset + uVar7)) {
    uVar4 = pSVar8->m_dataSize;
    while (((uVar4 != 0 && (pSVar8->m_writeOffset <= pSVar8->m_readOffset)) &&
           (((ulong)pSVar8->m_readOffset < pSVar8->m_writeOffset + uVar7 &&
            ((pSVar8->m_state & 4) == 0))))) {
      pSVar8->m_readSemaphoreWaitCount = pSVar8->m_readSemaphoreWaitCount + 1;
      LOCK();
      if (pSVar8->m_lock == 1) {
        pSVar8->m_lock = 0;
      }
      UNLOCK();
      iVar3 = sem_wait((sem_t *)(this->super_ShmtBase).m_readSemaphore.m_sem.
                                super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                                .m_h);
      if (iVar3 != 0) {
        err::setLastSystemError();
      }
      pSVar8 = (this->super_ShmtBase).m_hdr;
      while( true ) {
        piVar1 = &pSVar8->m_lock;
        LOCK();
        bVar15 = *piVar1 == 0;
        if (bVar15) {
          *piVar1 = 1;
        }
        UNLOCK();
        if (bVar15) break;
        sched_yield();
      }
      pSVar8 = (this->super_ShmtBase).m_hdr;
      uVar4 = pSVar8->m_dataSize;
    }
    if ((pSVar8->m_state & 4) != 0) {
      LOCK();
      if (pSVar8->m_lock == 1) {
        pSVar8->m_lock = 0;
      }
      UNLOCK();
      err::Error::Error((Error *)&local_48,0x10);
      local_68.m_p = (ErrorHdr *)0x0;
      local_68.m_hdr = (BufHdr *)0x0;
      local_68.m_size = 0;
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_68,&local_48);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
      err::setError((ErrorRef *)&local_68);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_68);
      uVar10 = 0xffffffffffffffff;
      goto LAB_001274da;
    }
  }
  uVar12 = (ulong)pSVar8->m_writeOffset;
  LOCK();
  if (pSVar8->m_lock == 1) {
    pSVar8->m_lock = 0;
  }
  UNLOCK();
  bVar15 = ShmtBase::ensureMappingSize(&this->super_ShmtBase,uVar12 + uVar7 + 0x28);
  uVar10 = 0xffffffffffffffff;
  if (bVar15) {
    p_Var9 = extraout_RDX;
    if (((this->super_ShmtBase).m_flags & 0x10000) == 0) {
      if (__n != 0) {
        pcVar13 = (this->super_ShmtBase).m_data + uVar12;
        sVar6 = 0;
        do {
          sVar2 = *(size_t *)((long)__buf + sVar6 * 8);
          __wrap_memcpy(pcVar13,*(void **)(CONCAT44(in_register_00000034,__fd) + sVar6 * 8),sVar2);
          pcVar13 = pcVar13 + sVar2;
          sVar6 = sVar6 + 1;
          p_Var9 = extraout_RDX_00;
        } while (__n != sVar6);
      }
    }
    else {
      pcVar14 = (this->super_ShmtBase).m_data;
      pcVar13 = pcVar14 + uVar12;
      pcVar13[0] = '\n';
      pcVar13[1] = 'm';
      pcVar13[2] = 's';
      pcVar13[3] = ':';
      *(int *)(pcVar14 + uVar12 + 4) = (int)uVar11;
      if (__n != 0) {
        pcVar14 = pcVar14 + uVar12 + 8;
        sVar6 = 0;
        do {
          sVar2 = *(size_t *)((long)__buf + sVar6 * 8);
          __wrap_memcpy(pcVar14,*(void **)(CONCAT44(in_register_00000034,__fd) + sVar6 * 8),sVar2);
          pcVar14 = pcVar14 + sVar2;
          sVar6 = sVar6 + 1;
          p_Var9 = extraout_RDX_01;
        } while (__n != sVar6);
      }
    }
    pSVar8 = (this->super_ShmtBase).m_hdr;
    while( true ) {
      piVar1 = &pSVar8->m_lock;
      LOCK();
      bVar15 = *piVar1 == 0;
      if (bVar15) {
        *piVar1 = 1;
      }
      UNLOCK();
      if (bVar15) break;
      sched_yield();
      p_Var9 = extraout_RDX_02;
    }
    __handler = (__sighandler_t)(uVar7 + uVar12);
    pSVar8 = (this->super_ShmtBase).m_hdr;
    uVar4 = (uint32_t)__handler;
    if ((pSVar8->m_readOffset < pSVar8->m_writeOffset) || (pSVar8->m_dataSize == 0)) {
      uVar5 = 0;
      if (__handler <= (__sighandler_t)this->m_sizeLimitHint) {
        uVar5 = uVar4;
      }
      pSVar8->m_writeOffset = uVar5;
      pSVar8->m_endOffset = uVar4;
    }
    else {
      pSVar8->m_writeOffset = uVar4;
      __handler = p_Var9;
    }
    pSVar8->m_dataSize = pSVar8->m_dataSize + (int)uVar11;
    if (pSVar8->m_writeSemaphoreWaitCount != 0) {
      sys::NamedSemaphore::signal
                (&(this->super_ShmtBase).m_writeSemaphore,pSVar8->m_writeSemaphoreWaitCount,
                 __handler);
      pSVar8 = (this->super_ShmtBase).m_hdr;
      pSVar8->m_writeSemaphoreWaitCount = 0;
    }
    LOCK();
    if (pSVar8->m_lock == 1) {
      pSVar8->m_lock = 0;
    }
    UNLOCK();
    uVar10 = uVar11;
  }
LAB_001274da:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_writeLock);
  return uVar10;
}

Assistant:

size_t
ShmtWriter::write(
	const void* const* blockArray,
	const size_t* sizeArray,
	size_t count
) {
	ASSERT(isOpen());

	bool result;

	size_t chainSize = 0;
	for (size_t i = 0; i < count; i++)
		chainSize += sizeArray[i];

	if (!chainSize)
		return 0;

	size_t writeSize = chainSize;

	if (m_flags & ShmtFlag_Message) {
		writeSize += sizeof(ShmtMessageHdr);
#if (_AXL_IO_SHMT_ALIGN_MESSAGES)
		writeSize = sl::align<AXL_PTR_SIZE> (writeSize);
#endif
	}

	sys::ScopeLock scopeLock(&m_writeLock); // ensure atomic write

	sys::atomicLock(&m_hdr->m_lock);

	// if buffer is wrapped, then wait until we have enough space

	if (m_hdr->m_dataSize &&
		m_hdr->m_writeOffset <= m_hdr->m_readOffset &&
		m_hdr->m_writeOffset + writeSize > m_hdr->m_readOffset) {
		while (
			m_hdr->m_dataSize &&
			m_hdr->m_writeOffset <= m_hdr->m_readOffset &&
			m_hdr->m_writeOffset + writeSize > m_hdr->m_readOffset &&
			!(m_hdr->m_state & ShmtState_Disconnected)) {
			m_hdr->m_readSemaphoreWaitCount++;
			sys::atomicUnlock(&m_hdr->m_lock);

			m_readSemaphore.wait();

			sys::atomicLock(&m_hdr->m_lock);
		}

		if (m_hdr->m_state & ShmtState_Disconnected) {
			sys::atomicUnlock(&m_hdr->m_lock);
			err::setError(err::SystemErrorCode_InvalidDeviceState);
			return -1;
		}
	}

	size_t writeOffset = m_hdr->m_writeOffset;

	sys::atomicUnlock(&m_hdr->m_lock);

	size_t writeEndOffset = writeOffset + writeSize;

	result = ensureOffsetMapped(writeEndOffset);
	if (!result)
		return -1;

	if (m_flags & ShmtFlag_Message) {
#if (_AXL_IO_SHMT_ALIGN_MESSAGES)
		ASSERT(sl::isAligned<AXL_PTR_SIZE> (writeOffset));
#endif

		ShmtMessageHdr* msgHdr = (ShmtMessageHdr*)(m_data + writeOffset);
		msgHdr->m_signature = ShmtConst_MessageSignature;
		msgHdr->m_size = chainSize;
		copyWriteChain(msgHdr + 1, blockArray, sizeArray, count);
	} else {
		copyWriteChain(m_data + writeOffset, blockArray, sizeArray, count);
	}

	sys::atomicLock(&m_hdr->m_lock);

	if (m_hdr->m_writeOffset <= m_hdr->m_readOffset && m_hdr->m_dataSize) { // wrapped
		m_hdr->m_writeOffset = writeEndOffset;
	} else {
		m_hdr->m_writeOffset = writeEndOffset > m_sizeLimitHint ? 0 : writeEndOffset;
		m_hdr->m_endOffset = writeEndOffset;
	}

	m_hdr->m_dataSize += chainSize;

	if (m_hdr->m_writeSemaphoreWaitCount) {
		m_writeSemaphore.signal(m_hdr->m_writeSemaphoreWaitCount);
		m_hdr->m_writeSemaphoreWaitCount = 0;
	}

	sys::atomicUnlock(&m_hdr->m_lock);

	return chainSize;
}